

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O0

void dumb_resample_get_current_sample_n_2_2
               (int n,DUMB_RESAMPLER *resampler,DUMB_VOLUME_RAMP_INFO *volume_left,
               DUMB_VOLUME_RAMP_INFO *volume_right,sample_t_conflict *dst)

{
  int in_EDI;
  undefined4 in_stack_00000020;
  DUMB_VOLUME_RAMP_INFO *in_stack_00000028;
  DUMB_RESAMPLER *in_stack_00000030;
  
  if (in_EDI == 8) {
    dumb_resample_get_current_sample_8_2_2
              (in_stack_00000030,in_stack_00000028,
               (DUMB_VOLUME_RAMP_INFO *)CONCAT44(n,in_stack_00000020),(sample_t_conflict *)resampler
              );
  }
  else if (in_EDI == 0x10) {
    dumb_resample_get_current_sample_16_2_2
              (in_stack_00000030,in_stack_00000028,
               (DUMB_VOLUME_RAMP_INFO *)CONCAT44(n,in_stack_00000020),(sample_t_conflict *)resampler
              );
  }
  else {
    dumb_resample_get_current_sample_2_2
              (in_stack_00000030,in_stack_00000028,
               (DUMB_VOLUME_RAMP_INFO *)CONCAT44(n,in_stack_00000020),(sample_t_conflict *)resampler
              );
  }
  return;
}

Assistant:

void dumb_resample_get_current_sample_n_2_2(int n, DUMB_RESAMPLER *resampler, DUMB_VOLUME_RAMP_INFO * volume_left, DUMB_VOLUME_RAMP_INFO * volume_right, sample_t *dst)
{
	if (n == 8)
		dumb_resample_get_current_sample_8_2_2(resampler, volume_left, volume_right, dst);
	else if (n == 16)
		dumb_resample_get_current_sample_16_2_2(resampler, volume_left, volume_right, dst);
	else
		dumb_resample_get_current_sample_2_2(resampler, volume_left, volume_right, dst);
}